

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.cpp
# Opt level: O2

int __thiscall ncnn::Exp::forward_inplace(Exp *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  int iVar2;
  int i_1;
  int i;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  int q;
  int iVar6;
  float fVar7;
  Mat local_70;
  
  uVar4 = bottom_top_blob->h * bottom_top_blob->w;
  uVar3 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar3;
  }
  iVar2 = bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    iVar2 = 0;
  }
  if (this->base == -1.0) {
    for (iVar6 = 0; iVar6 != iVar2; iVar6 = iVar6 + 1) {
      Mat::channel(&local_70,bottom_top_blob,iVar6);
      pvVar1 = local_70.data;
      Mat::~Mat(&local_70);
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        fVar7 = expf(this->scale * *(float *)((long)pvVar1 + uVar3 * 4) + this->shift);
        *(float *)((long)pvVar1 + uVar3 * 4) = fVar7;
      }
    }
  }
  else {
    while (iVar6 = (int)uVar3, iVar6 != iVar2) {
      Mat::channel(&local_70,bottom_top_blob,iVar6);
      pvVar1 = local_70.data;
      Mat::~Mat(&local_70);
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        fVar7 = powf(this->base,this->scale * *(float *)((long)pvVar1 + uVar3 * 4) + this->shift);
        *(float *)((long)pvVar1 + uVar3 * 4) = fVar7;
      }
      uVar3 = (ulong)(iVar6 + 1);
    }
  }
  return 0;
}

Assistant:

int Exp::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (base == -1.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = exp(shift + ptr[i] * scale);
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = pow(base, (shift + ptr[i] * scale));
            }
        }
    }

    return 0;
}